

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_assign.hpp
# Opt level: O1

void boost::numeric::ublas::
     vector_assign<boost::numeric::ublas::scalar_assign,boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::vector_binary<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
               (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *v,undefined8 *e)

{
  ulong *puVar1;
  ulong *puVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar7;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar8;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar9;
  ulong uVar10;
  ulong uVar11;
  size_type sVar12;
  ulong uVar13;
  size_t sVar14;
  double *__src;
  ulong uVar15;
  ulong *__src_00;
  double dVar16;
  double dVar17;
  const_subiterator2_type it2;
  const_subiterator1_type it1_end;
  const_subiterator1_type it1;
  const_subiterator2_type it2_end;
  long local_70;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_68;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_58;
  long local_50;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_48;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_38;
  
  v->filled_ = 0;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)*e,0);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)*e,((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)*e)->size_);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)e[1],0);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)e[1],*(size_type *)*e);
  pcVar8 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)*e;
  pcVar9 = local_48;
  if (local_48 == local_58) {
    pcVar9 = pcVar8;
  }
  pcVar7 = local_68;
  if (local_68 == local_38) {
    pcVar7 = pcVar8;
  }
  uVar15 = pcVar9->size_;
  if (pcVar7->size_ < pcVar9->size_) {
    uVar15 = pcVar7->size_;
  }
  sVar12 = pcVar8->size_;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find(pcVar8,sVar12);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)*e,((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)*e)->size_);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)e[1],sVar12);
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::find((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *)e[1],*(size_type *)*e);
  pcVar8 = local_48;
  if (local_48 == local_58) {
    pcVar8 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)*e;
  }
  pcVar9 = local_68;
  if (local_68 == local_38) {
    pcVar9 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)*e;
  }
  uVar13 = pcVar8->size_;
  if (pcVar9->size_ < pcVar8->size_) {
    uVar13 = pcVar9->size_;
  }
  while (uVar15 != uVar13) {
    dVar16 = 0.0;
    if ((local_48 != local_58) && (local_48->size_ == uVar15)) {
      dVar16 = *(double *)
                ((long)local_48 + (*(long *)(local_50 + 0x40) - *(long *)(local_50 + 0x28)));
    }
    dVar17 = 0.0;
    if ((local_68 != local_38) && (local_68->size_ == uVar15)) {
      dVar17 = *(double *)
                ((long)local_68 + (*(long *)(local_70 + 0x40) - *(long *)(local_70 + 0x28)));
    }
    dVar16 = dVar16 * dVar17;
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      if (v->capacity_ <= v->filled_) {
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::reserve(v,v->capacity_ * 2,true);
      }
      uVar10 = v->filled_;
      puVar2 = (v->index_data_).data_;
      puVar1 = puVar2 + uVar10;
      __src_00 = puVar2;
      if (((uVar10 != 0) && (*puVar2 < uVar15)) &&
         (__src_00 = puVar1, uVar5 = uVar10, puVar6 = puVar2, uVar15 <= puVar1[-1])) {
        while (__src_00 = puVar6, uVar4 = uVar5, 0 < (long)uVar4) {
          uVar11 = uVar4 >> 1;
          uVar5 = uVar11;
          puVar6 = __src_00;
          if (__src_00[uVar11] < uVar15) {
            uVar5 = ~uVar11 + uVar4;
            puVar6 = __src_00 + uVar11 + 1;
          }
        }
      }
      v->filled_ = uVar10 + 1;
      sVar14 = (long)puVar1 - (long)__src_00;
      if (sVar14 != 0) {
        memmove((void *)((long)puVar2 + ((uVar10 * 8 + 8) - sVar14)),__src_00,sVar14);
      }
      *__src_00 = uVar15;
      pdVar3 = (v->value_data_).data_;
      __src = (double *)(((long)__src_00 - (long)puVar2) + (long)pdVar3);
      sVar14 = (long)pdVar3 + ((v->filled_ * 8 + -8) - (long)__src);
      if (sVar14 != 0) {
        memmove((void *)((long)pdVar3 + (v->filled_ * 8 - sVar14)),__src,sVar14);
      }
      *__src = dVar16;
    }
    uVar10 = *(ulong *)*e;
    sVar12 = uVar10;
    if ((local_48 != local_58) &&
       (local_48 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)(&local_48->size_ + (local_48->size_ <= uVar15)), local_48 != local_58)) {
      sVar12 = local_48->size_;
    }
    if ((local_68 != local_38) &&
       (local_68 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)(&local_68->size_ + (local_68->size_ <= uVar15)), local_68 != local_38)) {
      uVar10 = local_68->size_;
    }
    uVar15 = sVar12;
    if (uVar10 < sVar12) {
      uVar15 = uVar10;
    }
  }
  return;
}

Assistant:

void vector_assign (V &v, const vector_expression<E> &e, sparse_tag) {
        BOOST_UBLAS_CHECK (v.size () == e ().size (), bad_size ());
        typedef F<typename V::iterator::reference, typename E::value_type> functor_type;
        BOOST_STATIC_ASSERT ((!functor_type::computed));
        typedef typename V::value_type value_type;
#if BOOST_UBLAS_TYPE_CHECK
        vector<value_type> cv (v.size ());
        indexing_vector_assign<scalar_assign> (cv, v);
        indexing_vector_assign<F> (cv, e);
#endif
        v.clear ();
        typename E::const_iterator ite (e ().begin ());
        typename E::const_iterator ite_end (e ().end ());
        while (ite != ite_end) {
            value_type t (*ite);
            if (t != value_type/*zero*/())
                v.insert_element (ite.index (), t);
            ++ ite;
        }
#if BOOST_UBLAS_TYPE_CHECK
        if (! disable_type_check<bool>::value) 
            BOOST_UBLAS_CHECK (detail::expression_type_check (v, cv), 
                               external_logic ("external logic or bad condition of inputs"));
#endif
    }